

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ValueColor(char *prefix,ImU32 v)

{
  undefined1 auVar1 [16];
  ImVec4 local_18;
  
  Text("%s: %08X",prefix,v);
  SameLine(0.0,-1.0);
  auVar1._0_4_ = (float)(v & 0xff);
  auVar1._4_4_ = (float)(v >> 8 & 0xff);
  auVar1._8_4_ = (float)(v >> 0x10 & 0xff);
  auVar1._12_4_ = (float)(v >> 0x18);
  local_18 = (ImVec4)divps(auVar1,_DAT_001826a0);
  ColorButton(&local_18,true,true);
  return;
}

Assistant:

void ImGui::ValueColor(const char* prefix, ImU32 v)
{
    Text("%s: %08X", prefix, v);
    SameLine();

    ImVec4 col;
    col.x = (float)((v >> 0) & 0xFF) / 255.0f;
    col.y = (float)((v >> 8) & 0xFF) / 255.0f;
    col.z = (float)((v >> 16) & 0xFF) / 255.0f;
    col.w = (float)((v >> 24) & 0xFF) / 255.0f;
    ColorButton(col, true);
}